

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O2

RC __thiscall QL_NodeRel::GetNext(QL_NodeRel *this,char *data)

{
  RC RVar1;
  RC RVar2;
  char *recData;
  RM_Record rec;
  char *local_38;
  RM_Record local_30;
  
  RM_Record::RM_Record(&local_30);
  RVar1 = RetrieveNextRec(this,&local_30,&local_38);
  if (RVar1 == 0) {
    memcpy(data,local_38,(long)(this->super_QL_Node).tupleLength);
    RVar2 = 0;
  }
  else {
    RVar2 = 0x199;
    if ((RVar1 != 0x6e) && (RVar1 != 0xd3)) {
      RVar2 = RVar1;
    }
  }
  RM_Record::~RM_Record(&local_30);
  return RVar2;
}

Assistant:

RC QL_NodeRel::GetNext(char *data){
  RC rc = 0;
  char *recData;
  RM_Record rec;
  if((rc = RetrieveNextRec(rec, recData))){
    if(rc == RM_EOF || rc == IX_EOF){
      return (QL_EOI);
    }
    return (rc);
  }
  memcpy(data, recData, tupleLength);
  return (0);
}